

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O3

void __thiscall cppcms::widgets::numeric<double>::validate(numeric<double> *this)

{
  validate((numeric<double> *)(&this->super_base_html_input + *(long *)(*(long *)this + -0x28)));
  return;
}

Assistant:

virtual bool validate()
			{
				if(!valid())
					return false;
				if(!set()) {
					if(non_empty_) {
						valid(false);
						return false;
					}
					return true;
				}
				if(check_low_ && value_ <min_) {
					valid(false);
					return false;
				}
				if(check_high_ && value_ > max_) {
					valid(false);
					return false;
				}
				return true;
			}